

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O2

RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> __thiscall
capnp::
makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult,capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::Client,capnproto_test::capnp::test::TestSturdyRef,capnp::Text>
          (capnp *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>
          *network,Client *bootstrapInterface,Client *gateway)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  Impl *extraout_RDX;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar4;
  undefined1 local_60 [8];
  Own<capnp::ClientHook> local_58;
  NullableValue<capnp::Capability::Client> local_48;
  undefined1 local_30 [32];
  
  local_48.isSet = true;
  local_48.field_1.value.hook.disposer = (bootstrapInterface->hook).disposer;
  local_48.field_1.value.hook.ptr = (bootstrapInterface->hook).ptr;
  (bootstrapInterface->hook).ptr = (ClientHook *)0x0;
  Capability::Client::
  castAs<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>>
            ((Client *)local_60,
             (Client *)((long)&gateway->_vptr_Client + (long)gateway->_vptr_Client[-3]));
  local_30[0] = true;
  p_Var1 = *(_func_int **)((long)local_60 + -0x18);
  uVar2 = *(undefined8 *)(local_60 + (long)p_Var1);
  uVar3 = *(undefined8 *)(p_Var1 + (long)(local_60 + 8));
  *(undefined8 *)(p_Var1 + (long)(local_60 + 8)) = 0;
  local_30._8_8_ =
       &RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::
        Client::typeinfo;
  local_30._16_8_ = uVar2;
  local_30._24_8_ = uVar3;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
  RpcSystem<capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>
            ((RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *)this,network,
             (Maybe<capnp::Capability::Client> *)&local_48,
             (Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
              *)local_30);
  kj::_::
  NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  ::~NullableValue((NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
                    *)local_30);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_60 + 8));
  kj::_::NullableValue<capnp::Capability::Client>::~NullableValue(&local_48);
  RVar4.super_RpcSystemBase.impl.ptr = extraout_RDX;
  RVar4.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>)RVar4.super_RpcSystemBase.impl
  ;
}

Assistant:

RpcSystem<VatId> makeRpcServer(
    VatNetwork<VatId, ProvisionId, RecipientId, ThirdPartyCapId, JoinResult>& network,
    Capability::Client bootstrapInterface, RealmGatewayClient gateway) {
  return RpcSystem<VatId>(network, kj::mv(bootstrapInterface),
      gateway.template castAs<RealmGateway<>>());
}